

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrti.h
# Opt level: O2

void __thiscall
SqrtiTest::SqrtiTest
          (SqrtiTest *this,input_generator_t *inputGenerator,input_range_t *inputRange,
          uint64_t samplesInRange)

{
  allocator<char> local_61;
  function<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(const_std::pair<unsigned_int,_unsigned_int>_&,_unsigned_long)>
  local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"sqrti",&local_61);
  std::
  function<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(const_std::pair<unsigned_int,_unsigned_int>_&,_unsigned_long)>
  ::function(&local_60,inputGenerator);
  Test<unsigned_int,unsigned_int,double>::
  Test<unsigned_int(*)(unsigned_int),unsigned_int(*)(unsigned_int)>
            ((Test<unsigned_int,unsigned_int,double> *)this,&local_40,&local_60,*inputRange,
             samplesInRange,sqrti_reference,dummyFunc);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

SqrtiTest(input_generator_t inputGenerator, const input_range_t& inputRange, uint64_t samplesInRange)
        : Test(
            "sqrti", inputGenerator,
            fixupInputRange(inputRange), samplesInRange, &sqrti_reference, &dummyFunc)
    {
    }